

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExitNode.cpp
# Opt level: O3

bool __thiscall ExitNode::removeJoinSuccessor(ExitNode *this,JoinNode *joinNode)

{
  size_t sVar1;
  JoinNode *pJVar2;
  set<const_ExitNode_*,_std::less<const_ExitNode_*>,_std::allocator<const_ExitNode_*>_> *this_00;
  bool bVar3;
  pair<std::_Rb_tree_iterator<JoinNode_*>,_std::_Rb_tree_iterator<JoinNode_*>_> pVar4;
  pair<std::_Rb_tree_iterator<const_ExitNode_*>,_std::_Rb_tree_iterator<const_ExitNode_*>_> pVar5;
  JoinNode *local_30;
  ExitNode *local_28;
  
  if (joinNode == (JoinNode *)0x0) {
    bVar3 = false;
  }
  else {
    local_30 = joinNode;
    pVar4 = std::
            _Rb_tree<JoinNode_*,_JoinNode_*,_std::_Identity<JoinNode_*>,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>
            ::equal_range(&(this->joinSuccessors_)._M_t,&local_30);
    std::
    _Rb_tree<JoinNode_*,_JoinNode_*,_std::_Identity<JoinNode_*>,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>
    ::_M_erase_aux(&(this->joinSuccessors_)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
    pJVar2 = local_30;
    this_00 = &local_30->joinPredecessors_;
    local_28 = this;
    pVar5 = std::
            _Rb_tree<const_ExitNode_*,_const_ExitNode_*,_std::_Identity<const_ExitNode_*>,_std::less<const_ExitNode_*>,_std::allocator<const_ExitNode_*>_>
            ::equal_range(&this_00->_M_t,&local_28);
    sVar1 = (pJVar2->joinPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<const_ExitNode_*,_const_ExitNode_*,_std::_Identity<const_ExitNode_*>,_std::less<const_ExitNode_*>,_std::allocator<const_ExitNode_*>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
    bVar3 = sVar1 != (pJVar2->joinPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  return bVar3;
}

Assistant:

bool ExitNode::removeJoinSuccessor(JoinNode *joinNode) {
    if (!joinNode) {
        return false;
    }
    joinSuccessors_.erase(joinNode);
    return joinNode->joinPredecessors_.erase(this);
}